

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda.c
# Opt level: O2

void xc_lda_vxc_fxc_kxc(xc_func_type *p,size_t np,double *rho,double *vrho,double *v2rho2,
                       double *v3rho3)

{
  xc_lda_out_params out;
  
  out.zk = (double *)0x0;
  out.v4rho4 = (double *)0x0;
  out.vrho = vrho;
  out.v2rho2 = v2rho2;
  out.v3rho3 = v3rho3;
  xc_lda_new(p,3,np,rho,&out);
  return;
}

Assistant:

void
xc_lda_vxc_fxc_kxc(const xc_func_type *p, size_t np, const double *rho, double *vrho, double *v2rho2, double *v3rho3)
{
  xc_lda_out_params out;
  libxc_memset(&out, 0, sizeof(xc_lda_out_params));
  out.vrho   = vrho;
  out.v2rho2 = v2rho2;
  out.v3rho3 = v3rho3;

  xc_lda_new(p, 3, np, rho, &out);
}